

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueArg.h
# Opt level: O0

void __thiscall
TCLAP::ValueArg<unsigned_long>::_extractValue(ValueArg<unsigned_long> *this,string *val)

{
  long *plVar1;
  ulong uVar2;
  char *__rhs;
  string *in_RSI;
  string *in_RDI;
  CmdLineParseException *unaff_retaddr;
  ArgParseException *e;
  ValueLike *in_stack_00000130;
  string *in_stack_00000138;
  unsigned_long *in_stack_00000140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  undefined1 local_f8 [224];
  ValueLike local_18;
  string *text;
  
  local_18._vptr_ValueLike = (_func_int **)0x0;
  text = in_RDI;
  ValueLike::ValueLike(&local_18);
  ExtractValue<unsigned_long>(in_stack_00000140,in_stack_00000138,in_stack_00000130);
  ValueLike::~ValueLike(&local_18);
  if ((*(long *)((long)&in_RDI[6].field_2 + 8) != 0) &&
     (plVar1 = *(long **)((long)&in_RDI[6].field_2 + 8),
     uVar2 = (**(code **)(*plVar1 + 0x10))(plVar1,&in_RDI[5]._M_string_length), (uVar2 & 1) == 0)) {
    uVar3 = 1;
    __rhs = (char *)__cxa_allocate_exception(0x68);
    std::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    std::operator+(in_stack_fffffffffffffeb8,__rhs);
    (**(code **)**(undefined8 **)((long)&in_RDI[6].field_2 + 8))(local_f8);
    std::operator+(in_stack_fffffffffffffee8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar3,in_stack_fffffffffffffee0));
    (**(code **)(*(long *)in_RDI + 0x38))(&stack0xfffffffffffffee8);
    CmdLineParseException::CmdLineParseException(unaff_retaddr,text,in_RSI);
    __cxa_throw(__rhs,&CmdLineParseException::typeinfo,CmdLineParseException::~CmdLineParseException
               );
  }
  return;
}

Assistant:

void ValueArg<T>::_extractValue( const std::string& val ) 
{
    try {
	ExtractValue(_value, val, typename ArgTraits<T>::ValueCategory());
    } catch( ArgParseException &e) {
	throw ArgParseException(e.error(), toString());
    }
    
    if ( _constraint != NULL )
	if ( ! _constraint->check( _value ) )
	    throw( CmdLineParseException( "Value '" + val + 
					  + "' does not meet constraint: " 
					  + _constraint->description(),
					  toString() ) );
}